

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O3

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewEnd(LocationUpdater *this,BinaryLocation oldEnd)

{
  BinaryLocation BVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  BinaryLocation local_24;
  BinaryLocation local_20;
  BinaryLocation local_1c;
  
  local_1c = oldEnd;
  cVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Expression_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Expression_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->oldExprAddrMap).endMap._M_h,&local_1c);
  if ((cVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>.
       _M_cur == (__node_type *)0x0) ||
     (*(long *)((long)cVar2.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Expression_*>,_false>
                      ._M_cur + 0x10) == 0)) {
    local_20 = oldEnd;
    cVar3 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Function_*>,_std::allocator<std::pair<const_unsigned_int,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->oldFuncAddrMap).endMap._M_h,&local_20);
    if ((cVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Function_*>,_false>.
         _M_cur == (__node_type *)0x0) ||
       (*(long *)((long)cVar3.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Function_*>,_false>
                        ._M_cur + 0x10) == 0)) {
      local_24 = oldEnd;
      cVar4 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->oldExprAddrMap).delimiterMap._M_h,&local_24);
      if ((cVar4.
           super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_false>
           ._M_cur == (__node_type *)0x0) ||
         (*(long *)((long)cVar4.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Debug::AddrExprMap::DelimiterInfo>,_false>
                          ._M_cur + 0x10) == 0)) {
        BVar1 = 0;
      }
      else {
        BVar1 = getNewDelimiter(this,oldEnd);
      }
    }
    else {
      BVar1 = getNewFuncEnd(this,oldEnd);
    }
  }
  else {
    BVar1 = getNewExprEnd(this,oldEnd);
  }
  return BVar1;
}

Assistant:

BinaryLocation getNewEnd(BinaryLocation oldEnd) const {
    if (hasOldExprEnd(oldEnd)) {
      return getNewExprEnd(oldEnd);
    } else if (hasOldFuncEnd(oldEnd)) {
      return getNewFuncEnd(oldEnd);
    } else if (hasOldDelimiter(oldEnd)) {
      return getNewDelimiter(oldEnd);
    }
    return 0;
  }